

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O2

int CVmRun::get_prop_no_eval
              (vm_val_t **target_obj,vm_prop_id_t target_prop,uint *argc,vm_obj_id_t *srcobj,
              vm_val_t *val,vm_val_t **self,vm_val_t *new_self)

{
  vm_val_t *self_val;
  char *pcVar1;
  int iVar2;
  vm_obj_id_t vVar3;
  uint uVar4;
  uint uVar5;
  
  self_val = *target_obj;
  switch(self_val->typ) {
  case VM_NIL:
    err_throw(0x89b);
  case VM_OBJ:
    uVar4 = (self_val->val).obj & 0xfff;
    iVar2 = (**(code **)(*(long *)&G_obj_table_X.pages_[(self_val->val).obj >> 0xc][uVar4].ptr_ +
                        0x68))(G_obj_table_X.pages_[(self_val->val).obj >> 0xc] + uVar4,target_prop,
                               val);
    if ((*self)->typ == VM_OBJ) {
      return iVar2;
    }
    break;
  case VM_SSTRING:
    if (((*self)->typ == VM_SSTRING) && (uVar4 = ((*self)->val).obj, uVar4 == (self_val->val).obj))
    {
      uVar5 = G_const_pool_X.super_CVmPoolPaged._8_4_ - 1;
      pcVar1 = G_const_pool_X.super_CVmPoolPaged.pages_
               [uVar4 >> ((byte)G_const_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].mem;
      iVar2 = CVmObjString::const_get_prop
                        (val,self_val,pcVar1 + (uVar5 & uVar4),target_prop,srcobj,argc);
      if (iVar2 == 0) {
        return 0;
      }
      if (VM_BIFPTRX < val->typ) {
        return iVar2;
      }
      if ((0x60800U >> (val->typ & (VM_BIFPTR|VM_ENUM)) & 1) == 0) {
        return iVar2;
      }
      vVar3 = CVmObjStringConst::create(pcVar1 + (uVar5 & uVar4));
LAB_001e6dd8:
      new_self->typ = VM_OBJ;
      (new_self->val).obj = vVar3;
      *self = new_self;
      *target_obj = new_self;
      return iVar2;
    }
    break;
  case VM_LIST:
    if (((*self)->typ == VM_LIST) && (uVar4 = ((*self)->val).obj, uVar4 == (self_val->val).obj)) {
      uVar5 = G_const_pool_X.super_CVmPoolPaged._8_4_ - 1;
      pcVar1 = G_const_pool_X.super_CVmPoolPaged.pages_
               [uVar4 >> ((byte)G_const_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].mem;
      iVar2 = CVmObjList::const_get_prop
                        (val,self_val,pcVar1 + (uVar5 & uVar4),target_prop,srcobj,argc);
      if (iVar2 == 0) {
        return 0;
      }
      if (VM_BIFPTRX < val->typ) {
        return iVar2;
      }
      if ((0x60800U >> (val->typ & (VM_BIFPTR|VM_ENUM)) & 1) == 0) {
        return iVar2;
      }
      vVar3 = CVmObjListConst::create(pcVar1 + (uVar5 & uVar4));
      goto LAB_001e6dd8;
    }
  }
  err_throw(0x7da);
}

Assistant:

inline int CVmRun::get_prop_no_eval(VMG_ const vm_val_t **target_obj,
                                    vm_prop_id_t target_prop,
                                    uint *argc, vm_obj_id_t *srcobj,
                                    vm_val_t *val,
                                    const vm_val_t **self,
                                    vm_val_t *new_self)
{
    int found;
    const char *target_ptr;
    
    /* 
     *   we can evaluate properties of regular objects, as well as string
     *   and list constants - see what we have 
     */
    switch((*target_obj)->typ)
    {
    case VM_LIST:
        /* 'self' must be the same as the target for a constant list */
        if ((*self)->typ != (*target_obj)->typ
            || (*self)->val.ofs != (*target_obj)->val.ofs)
            err_throw(VMERR_OBJ_VAL_REQD);

        /* translate the list offset to a physical pointer */
        target_ptr = G_const_pool->get_ptr((*target_obj)->val.ofs);

        /* evaluate the constant list property */
        found = CVmObjList::const_get_prop(vmg_ val, *target_obj,
                                           target_ptr, target_prop,
                                           srcobj, argc);

        /* 
         *   If the result is a method to run, we need an actual object for
         *   'self'.  In this case, create a dynamic list object with the
         *   same contents as the constant list value.  
         */
        if (found
            && (val->typ == VM_CODEOFS
                || val->typ == VM_OBJX
                || val->typ == VM_BIFPTRX))
        {
            /* create the list */
            new_self->set_obj(CVmObjListConst::create(vmg_ target_ptr));

            /* use it as the new 'self' and the new effective target */
            *self = new_self;
            *target_obj = new_self;
        }

        /* go evaluate the result as normal */
        break;

    case VM_SSTRING:
        /* 'self' must be the same as the target for a constant string */
        if ((*self)->typ != (*target_obj)->typ
            || (*self)->val.ofs != (*target_obj)->val.ofs)
            err_throw(VMERR_OBJ_VAL_REQD);

        /* translate the string offset to a physical pointer */
        target_ptr = G_const_pool->get_ptr((*target_obj)->val.ofs);

        /* evaluate the constant string property */
        found = CVmObjString::const_get_prop(vmg_ val, *target_obj,
                                             target_ptr, target_prop,
                                             srcobj, argc);

        /* 
         *   If the result is a method to run, we need an actual object for
         *   'self'.  In this case, create a dynamic string object with the
         *   same contents as the constant string value.  
         */
        if (found
            && (val->typ == VM_CODEOFS
                || val->typ == VM_OBJX
                || val->typ == VM_BIFPTRX))
        {
            /* create the string */
            new_self->set_obj(CVmObjStringConst::create(vmg_ target_ptr));

            /* it's the new 'self' and the new effective target object */
            *self = new_self;
            *target_obj = new_self;
        }

        /* go evaluate the result as normal */
        break;

    case VM_OBJ:
        /* get the property value from the target object */
        found = vm_objp(vmg_ (*target_obj)->val.obj)
                ->get_prop(vmg_ target_prop, val, (*target_obj)->val.obj,
                           srcobj, argc);

        /* 'self' must be an object as well */
        if ((*self)->typ != VM_OBJ)
            err_throw(VMERR_OBJ_VAL_REQD);
        break;

    case VM_NIL:
        /* nil pointer dereferenced */
        err_throw(VMERR_NIL_DEREF);

    default:
        /* we can't evaluate properties of anything else */
        err_throw(VMERR_OBJ_VAL_REQD);
    }

    /* return the 'found' indication */
    return found;
}